

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  Config *this_00;
  IStreamingReporter *p;
  ostream *poVar5;
  domain_error *this_01;
  Ptr<Catch::Config> *in_RDI;
  ostringstream oss;
  string reporterName;
  Config *in_stack_fffffffffffffda8;
  Ptr<Catch::IConfig> *in_stack_fffffffffffffdb0;
  string local_200 [32];
  ostringstream local_1e0 [376];
  undefined1 local_68 [30];
  byte local_4a;
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  Ptr<Catch::Config>::operator->(in_RDI);
  Config::getReporterName_abi_cxx11_(in_stack_fffffffffffffda8);
  uVar3 = std::__cxx11::string::empty();
  local_4a = 0;
  if ((uVar3 & 1) == 0) {
    Ptr<Catch::Config>::operator->(in_RDI);
    Config::getReporterName_abi_cxx11_(in_stack_fffffffffffffda8);
  }
  else {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string(local_28,"console",&local_49);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  std::__cxx11::string::~string(local_48);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[2])();
  this_00 = Ptr<Catch::Config>::get(in_RDI);
  Ptr<Catch::IConfig>::Ptr(in_stack_fffffffffffffdb0,(IConfig *)in_stack_fffffffffffffda8);
  p = (IStreamingReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar2),local_28,local_68);
  Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this_00,p);
  Ptr<Catch::IConfig>::~Ptr(in_stack_fffffffffffffdb0);
  bVar1 = Ptr<Catch::IStreamingReporter>::operator!
                    ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x41));
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,"No reporter registered with name: \'");
    poVar5 = std::operator<<(poVar5,local_28);
    std::operator<<(poVar5,"\'");
    this_01 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this_01,local_200);
    __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }